

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void int8_suite::test_negative_min(void)

{
  bool bVar1;
  long lVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  long local_68;
  undefined4 local_5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [2];
  
  local_38[0].buffer = &local_58;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38[0].super_base<unsigned_char>._vptr_base = (_func_int **)&PTR__base_00112d48;
  bVar1 = trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::grow
                    (local_38,2);
  if (bVar1) {
    (*local_38[0].super_base<unsigned_char>._vptr_base[3])(local_38,0xa0);
    lVar2 = 2;
    (*local_38[0].super_base<unsigned_char>._vptr_base[3])(local_38,0xdf);
  }
  else {
    lVar2 = 0;
  }
  local_5c = 2;
  local_68 = lVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int8_t(-33))","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xad,"void int8_suite::test_negative_min()",&local_68,&local_5c);
  local_68 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xae,"void int8_suite::test_negative_min()",&local_68,&local_5c);
  local_68._0_4_ = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xaf,"void int8_suite::test_negative_min()",
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_68);
  local_68 = CONCAT44(local_68._4_4_,0xdf);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0xDF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xb0,"void int8_suite::test_negative_min()",
             local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,&local_68);
  (**local_38[0].super_base<unsigned_char>._vptr_base)();
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}